

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr
GetFunctionTypeName(ExpressionContext *ctx,TypeBase *returnType,IntrusiveList<TypeHandle> arguments)

{
  char *__src;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  size_t sVar4;
  TypeHandle *pTVar5;
  TypeHandle *pTVar6;
  TypeHandle *pTVar7;
  TypeBase *pTVar8;
  TypeHandle *arg;
  char *pcVar9;
  InplaceStr IVar10;
  
  pTVar5 = arguments.tail;
  pTVar7 = arguments.head;
  uVar1 = (*(int *)&(returnType->name).end - *(int *)&(returnType->name).begin) + 7;
  pTVar6 = pTVar7;
  if (pTVar7 == (TypeHandle *)0x0) {
    pTVar8 = (TypeBase *)0x0;
  }
  else {
    do {
      pTVar8 = pTVar6->type;
      pTVar6 = pTVar6->next;
      uVar1 = (pTVar6 != (TypeHandle *)0x0) + uVar1 +
              (*(int *)&(pTVar8->name).end - *(int *)&(pTVar8->name).begin);
    } while (pTVar6 != (TypeHandle *)0x0);
    pTVar5 = (TypeHandle *)0x0;
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar1,pTVar8,pTVar5);
  IVar10.begin = (char *)CONCAT44(extraout_var,iVar2);
  pcVar9 = (returnType->name).begin;
  if (pcVar9 != (char *)0x0) {
    memcpy(IVar10.begin,pcVar9,(ulong)(uint)(*(int *)&(returnType->name).end - (int)pcVar9));
  }
  uVar3 = (ulong)(uint)(*(int *)&(returnType->name).end - *(int *)&(returnType->name).begin);
  builtin_strncpy(IVar10.begin + uVar3," ref(",5);
  pcVar9 = IVar10.begin + uVar3 + 5;
  for (; pTVar7 != (TypeHandle *)0x0; pTVar7 = pTVar7->next) {
    __src = (pTVar7->type->name).begin;
    if (__src != (char *)0x0) {
      memcpy(pcVar9,__src,(ulong)(uint)(*(int *)&(pTVar7->type->name).end - (int)__src));
    }
    pcVar9 = pcVar9 + (uint)(*(int *)&(pTVar7->type->name).end - *(int *)&(pTVar7->type->name).begin
                            );
    if (pTVar7->next != (TypeHandle *)0x0) {
      *pcVar9 = ',';
      pcVar9 = pcVar9 + 1;
    }
  }
  pcVar9[0] = ')';
  pcVar9[1] = '\0';
  sVar4 = strlen(IVar10.begin);
  if (sVar4 + 1 != (ulong)uVar1) {
    __assert_fail("strlen(name) + 1 == nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0xd7,
                  "InplaceStr GetFunctionTypeName(ExpressionContext &, TypeBase *, IntrusiveList<TypeHandle>)"
                 );
  }
  IVar10.end = IVar10.begin + sVar4;
  return IVar10;
}

Assistant:

InplaceStr GetFunctionTypeName(ExpressionContext &ctx, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	unsigned nameLength = returnType->name.length() + unsigned(strlen(" ref()")) + 1;

	for(TypeHandle *arg = arguments.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? 1 : 0);

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	if(returnType->name.begin)
		memcpy(pos, returnType->name.begin, returnType->name.length());
	pos += returnType->name.length();

	memcpy(pos, " ref(", 5);
	pos += 5;

	for(TypeHandle *arg = arguments.head; arg; arg = arg->next)
	{
		if(arg->type->name.begin)
			memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = ')';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}